

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

void * SySetAt(SySet *pSet,sxu32 nIdx)

{
  char *zBase;
  sxu32 nIdx_local;
  SySet *pSet_local;
  
  if (nIdx < pSet->nUsed) {
    pSet_local = (SySet *)((long)pSet->pBase + (ulong)(nIdx * pSet->eSize));
  }
  else {
    pSet_local = (SySet *)0x0;
  }
  return pSet_local;
}

Assistant:

JX9_PRIVATE void * SySetAt(SySet *pSet, sxu32 nIdx)
{
	const char *zBase;
	if( nIdx >= pSet->nUsed ){
		/* Out of range */
		return 0;
	}
	zBase = (const char *)pSet->pBase;
	return (void *)&zBase[nIdx * pSet->eSize]; 
}